

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-loader.cc
# Opt level: O3

expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::image::GetImageInfoFromMemory
            (expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,uint8_t *addr,size_t sz,string *uri)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  stbi__context *psVar3;
  stbi_uc **ppsVar4;
  undefined8 *puVar5;
  stbi_uc *psVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  stbi__jpeg *z;
  stbi__gif *g;
  void *pvVar11;
  byte bVar12;
  byte bVar13;
  long *in_FS_OFFSET;
  int h;
  ImageInfoResult ret;
  string err;
  uint local_19c;
  uint local_198;
  uint local_194;
  undefined4 local_190;
  undefined4 local_18c;
  stbi__context local_188;
  uint local_a8;
  uint uStack_a4;
  uint local_a0;
  char *local_98;
  size_type local_90;
  char local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  stbi__png local_58;
  
  local_90 = 0;
  local_88 = '\0';
  local_70 = 0;
  local_68 = 0;
  local_98 = &local_88;
  local_78 = &local_68;
  iVar7 = IsEXRFromMemory(addr,sz);
  if (iVar7 == 0) {
    local_188._0_8_ = "TODO: EXR format";
    nonstd::expected_lite::
    expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_188);
    goto LAB_004353bb;
  }
  local_194 = 0;
  local_198 = 0;
  local_19c = 0;
  local_188.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_188.read_from_callbacks = 0;
  local_188.callback_already_read = 0;
  local_188.img_buffer_end = addr + (int)sz;
  local_188.img_buffer = addr;
  local_188.img_buffer_original = addr;
  local_188.img_buffer_original_end = local_188.img_buffer_end;
  z = (stbi__jpeg *)calloc(1,0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -8) = "outofmem";
LAB_004352db:
    local_58.s = &local_188;
    iVar7 = stbi__parse_png_file(&local_58,2,0);
    psVar3 = local_58.s;
    if (iVar7 == 0) {
      ppsVar4 = &(local_58.s)->img_buffer_original_end;
      (local_58.s)->img_buffer = (local_58.s)->img_buffer_original;
      psVar3->img_buffer_end = *ppsVar4;
      g = (stbi__gif *)malloc(0x8870);
      if (g == (stbi__gif *)0x0) {
        *(char **)(*in_FS_OFFSET + -8) = "outofmem";
      }
      else {
        iVar7 = stbi__gif_header(&local_188,g,(int *)&local_19c,1);
        if (iVar7 != 0) {
          uVar8 = g->w;
          local_198 = g->h;
          free(g);
          goto LAB_0043531d;
        }
        free(g);
        local_188.img_buffer = local_188.img_buffer_original;
        local_188.img_buffer_end = local_188.img_buffer_original_end;
      }
      local_58.out._4_4_ = 0xff;
      pvVar11 = stbi__bmp_parse_header(&local_188,(stbi__bmp_data *)&local_58);
      if (pvVar11 == (void *)0x0) {
        local_188.img_buffer = local_188.img_buffer_original;
        local_188.img_buffer_end = local_188.img_buffer_original_end;
        iVar7 = stbi__get16be(&local_188);
        uVar8 = stbi__get16be(&local_188);
        if (((uVar8 | iVar7 << 0x10) == 0x38425053) &&
           (iVar7 = stbi__get16be(&local_188), iVar7 == 1)) {
          if ((local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
             (iVar7 = (int)local_188.img_buffer_end - (int)local_188.img_buffer, 5 < iVar7)) {
            local_188.img_buffer = local_188.img_buffer + 6;
          }
          else {
            local_188.img_buffer = local_188.img_buffer_end;
            (*local_188.io.skip)(local_188.io_user_data,6 - iVar7);
          }
          uVar8 = stbi__get16be(&local_188);
          if (uVar8 < 0x11) {
            iVar7 = stbi__get16be(&local_188);
            local_198 = stbi__get16be(&local_188);
            local_198 = iVar7 << 0x10 | local_198;
            iVar7 = stbi__get16be(&local_188);
            local_194 = stbi__get16be(&local_188);
            local_194 = iVar7 << 0x10 | local_194;
            iVar7 = stbi__get16be(&local_188);
            if (((iVar7 == 0x10) || (iVar7 == 8)) && (iVar7 = stbi__get16be(&local_188), iVar7 == 3)
               ) {
              local_19c = 4;
              uVar8 = local_194;
              goto LAB_0043531d;
            }
          }
        }
        local_188.img_buffer = local_188.img_buffer_original;
        local_188.img_buffer_end = local_188.img_buffer_original_end;
        iVar7 = stbi__pic_is4(&local_188,anon_var_dwarf_16b6bd0);
        if (iVar7 != 0) {
          if ((local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
             (iVar7 = (int)local_188.img_buffer_end - (int)local_188.img_buffer, 0x57 < iVar7)) {
            local_188.img_buffer = local_188.img_buffer + 0x58;
          }
          else {
            local_188.img_buffer = local_188.img_buffer_end;
            (*local_188.io.skip)(local_188.io_user_data,0x58 - iVar7);
          }
          uVar8 = stbi__get16be(&local_188);
          local_194 = uVar8;
          uVar9 = stbi__get16be(&local_188);
          local_198 = uVar9;
          if (local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_004356bb:
            if (local_188.img_buffer_end <= local_188.img_buffer) goto LAB_004356e7;
          }
          else {
            iVar7 = (*local_188.io.eof)(local_188.io_user_data);
            if (iVar7 != 0) {
              if (local_188.read_from_callbacks == 0) goto LAB_004356e7;
              goto LAB_004356bb;
            }
          }
          if ((uVar8 == 0) || (uVar9 <= (uint)(0x10000000 / (ulong)uVar8))) {
            if ((local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
               (iVar7 = (int)local_188.img_buffer_end - (int)local_188.img_buffer, 7 < iVar7)) {
              local_188.img_buffer = local_188.img_buffer + 8;
            }
            else {
              local_188.img_buffer = local_188.img_buffer_end;
              (*local_188.io.skip)(local_188.io_user_data,8 - iVar7);
            }
            bVar12 = 0;
            iVar7 = 0xb;
            do {
              puVar5 = (undefined8 *)local_188.buffer_start;
              iVar7 = iVar7 + -1;
              if (iVar7 == 0) goto LAB_004356f7;
              if (local_188.img_buffer < local_188.img_buffer_end) {
                local_18c = (undefined4)
                            CONCAT71((int7)((ulong)local_188.img_buffer >> 8),*local_188.img_buffer)
                ;
                local_188.img_buffer = local_188.img_buffer + 1;
              }
              else if (local_188.read_from_callbacks == 0) {
                local_18c = 0;
              }
              else {
                iVar10 = (*local_188.io.read)
                                   (local_188.io_user_data,(char *)puVar5,local_188.buflen);
                local_188.callback_already_read =
                     local_188.callback_already_read +
                     ((int)local_188.img_buffer - (int)local_188.img_buffer_original);
                if (iVar10 == 0) {
                  local_188.read_from_callbacks = 0;
                  local_188.buffer_start[0] = 0;
                  local_18c = 0;
                  local_188.img_buffer_end = local_188.buffer_start + 1;
                }
                else {
                  local_188.img_buffer_end = (stbi_uc *)((long)puVar5 + (long)iVar10);
                  local_18c = CONCAT31((int3)((uint)((int)local_188.img_buffer -
                                                    (int)local_188.img_buffer_original) >> 8),
                                       local_188.buffer_start[0]);
                }
                local_188.img_buffer = local_188.buffer_start + 1;
              }
              psVar6 = local_188.img_buffer;
              if (local_188.img_buffer < local_188.img_buffer_end) {
                local_188.img_buffer = local_188.img_buffer + 1;
                local_190 = (undefined4)CONCAT71((int7)((ulong)psVar6 >> 8),*psVar6);
              }
              else if (local_188.read_from_callbacks == 0) {
                local_190 = 0;
              }
              else {
                iVar10 = (*local_188.io.read)
                                   (local_188.io_user_data,(char *)puVar5,local_188.buflen);
                local_188.callback_already_read =
                     local_188.callback_already_read +
                     ((int)local_188.img_buffer - (int)local_188.img_buffer_original);
                if (iVar10 == 0) {
                  local_188.read_from_callbacks = 0;
                  local_188.buffer_start[0] = 0;
                  local_190 = 0;
                  local_188.img_buffer_end = local_188.buffer_start + 1;
                }
                else {
                  local_188.img_buffer_end = (stbi_uc *)((long)puVar5 + (long)iVar10);
                  local_190 = CONCAT31((int3)((uint)((int)local_188.img_buffer -
                                                    (int)local_188.img_buffer_original) >> 8),
                                       local_188.buffer_start[0]);
                }
                local_188.img_buffer = local_188.buffer_start + 1;
              }
              if (local_188.img_buffer < local_188.img_buffer_end) {
                local_188.img_buffer = local_188.img_buffer + 1;
              }
              else if (local_188.read_from_callbacks != 0) {
                iVar10 = (*local_188.io.read)
                                   (local_188.io_user_data,(char *)puVar5,local_188.buflen);
                local_188.callback_already_read =
                     local_188.callback_already_read +
                     ((int)local_188.img_buffer - (int)local_188.img_buffer_original);
                if (iVar10 == 0) {
                  local_188.read_from_callbacks = 0;
                  local_188.buffer_start[0] = 0;
                  local_188.img_buffer_end = local_188.buffer_start + 1;
                }
                else {
                  local_188.img_buffer_end = (stbi_uc *)((long)puVar5 + (long)iVar10);
                }
                local_188.img_buffer = local_188.buffer_start + 1;
              }
              psVar6 = local_188.img_buffer;
              if (local_188.img_buffer < local_188.img_buffer_end) {
                local_188.img_buffer = local_188.img_buffer + 1;
                bVar13 = *psVar6;
              }
              else if (local_188.read_from_callbacks == 0) {
                bVar13 = 0;
              }
              else {
                iVar10 = (*local_188.io.read)
                                   (local_188.io_user_data,(char *)puVar5,local_188.buflen);
                local_188.callback_already_read =
                     local_188.callback_already_read +
                     ((int)local_188.img_buffer - (int)local_188.img_buffer_original);
                if (iVar10 == 0) {
                  local_188.read_from_callbacks = 0;
                  local_188.buffer_start[0] = 0;
                  local_188.img_buffer_end = local_188.buffer_start + 1;
                }
                else {
                  local_188.img_buffer_end = (stbi_uc *)((long)puVar5 + (long)iVar10);
                }
                local_188.img_buffer = local_188.buffer_start + 1;
                bVar13 = local_188.buffer_start[0];
              }
              if (local_188.io.read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00435a8a:
                if (local_188.img_buffer_end <= local_188.img_buffer) goto LAB_004356e7;
              }
              else {
                iVar10 = (*local_188.io.eof)(local_188.io_user_data);
                if (iVar10 != 0) {
                  if (local_188.read_from_callbacks != 0) goto LAB_00435a8a;
                  goto LAB_004356e7;
                }
              }
              if ((char)local_190 != '\b') goto LAB_004356e7;
              bVar12 = bVar12 | bVar13;
            } while ((char)local_18c != '\0');
            local_19c = 4 - ((bVar12 & 0x10) == 0);
            uVar8 = local_194;
            goto LAB_0043531d;
          }
        }
LAB_004356e7:
        local_188.img_buffer = local_188.img_buffer_original;
        local_188.img_buffer_end = local_188.img_buffer_original_end;
LAB_004356f7:
        iVar7 = stbi__pnm_info(&local_188,(int *)&local_194,(int *)&local_198,(int *)&local_19c);
        uVar8 = local_194;
        if (((iVar7 == 0) &&
            (iVar7 = stbi__hdr_info(&local_188,(int *)&local_194,(int *)&local_198,(int *)&local_19c
                                   ), uVar8 = local_194, iVar7 == 0)) &&
           (iVar7 = stbi__tga_info(&local_188,(int *)&local_194,(int *)&local_198,(int *)&local_19c)
           , uVar8 = local_194, iVar7 == 0)) {
          *(char **)(*in_FS_OFFSET + -8) = "unknown image type";
          local_188._0_8_ = &local_188.io;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_188,local_78,local_78 + local_70);
          (__return_storage_ptr__->contained).
          super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = false;
          psVar2 = &(__return_storage_ptr__->contained).
                    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_value.warning;
          *(string **)
           &(__return_storage_ptr__->contained).
            super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0 = psVar2;
          if ((stbi_io_callbacks *)local_188._0_8_ == &local_188.io) {
            (psVar2->_M_dataplus)._M_p = (pointer)local_188.io.read;
            (__return_storage_ptr__->contained).
            super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value.warning._M_string_length = (size_type)local_188.io.skip;
          }
          else {
            (__return_storage_ptr__->contained).
            super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_dataplus._M_p = (pointer)local_188._0_8_;
            (__return_storage_ptr__->contained).
            super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value.warning._M_dataplus._M_p = (pointer)local_188.io.read;
          }
          (__return_storage_ptr__->contained).
          super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_string_length = local_188._8_8_;
          goto LAB_004353bb;
        }
      }
      else {
        local_194 = local_188.img_x;
        local_198 = local_188.img_y;
        local_19c = 4 - ((int)local_58.out == 0 ||
                        (int)local_58.out == -0x1000000 && (int)local_58.s == 0x18);
        uVar8 = local_188.img_x;
      }
    }
    else {
      local_194 = (local_58.s)->img_x;
      local_198 = (local_58.s)->img_y;
      local_19c = (local_58.s)->img_n;
      uVar8 = local_194;
    }
  }
  else {
    z->s = &local_188;
    iVar7 = stbi__decode_jpeg_header(z,2);
    psVar3 = z->s;
    if (iVar7 == 0) {
      psVar3->img_buffer = psVar3->img_buffer_original;
      psVar3->img_buffer_end = psVar3->img_buffer_original_end;
      free(z);
      goto LAB_004352db;
    }
    local_194 = psVar3->img_x;
    local_198 = psVar3->img_y;
    local_19c = (uint)(2 < psVar3->img_n) * 2 + 1;
    free(z);
    uVar8 = local_194;
  }
LAB_0043531d:
  local_a0 = local_19c;
  if ((int)local_19c < 1) {
    local_a0 = 0;
  }
  uStack_a4 = local_198;
  if ((int)local_198 < 1) {
    uStack_a4 = 0;
  }
  local_a8 = 0;
  if (0 < (int)uVar8) {
    local_a8 = uVar8;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_dataplus._M_p = (pointer)CONCAT44(uStack_a4,local_a8);
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.channels = local_a0;
  paVar1 = &(__return_storage_ptr__->contained).
            super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value.warning.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = paVar1;
  if (local_98 == &local_88) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_87,local_88);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0.m_value.warning.field_2 + 8) = uStack_80;
  }
  else {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.warning._M_dataplus._M_p = local_98;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.warning.field_2._M_allocated_capacity = CONCAT71(uStack_87,local_88);
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.warning._M_string_length = local_90;
  local_90 = 0;
  local_88 = '\0';
  local_98 = &local_88;
LAB_004353bb:
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<image::ImageInfoResult, std::string> GetImageInfoFromMemory(
    const uint8_t *addr, size_t sz, const std::string &uri) {
  image::ImageInfoResult ret;
  std::string err;

#if defined(TINYUSDZ_WITH_EXR)
  if (TINYEXR_SUCCESS == IsEXRFromMemory(addr, sz)) {

    return nonstd::make_unexpected("TODO: EXR format");
  }
#endif

#if defined(TINYUSDZ_WITH_TIFF)
  if (tinydng::IsDNGFromMemory(reinterpret_cast<const char *>(addr), uint32_t(sz), &err)) {

      return nonstd::make_unexpected("TODO: TIFF/DNG format");

  }
#endif

#if defined(TINYUSDZ_USE_WUFFS_IMAGE_LOADER)
  bool ok = GetImageInfoWUFF(addr, sz, uri, &ret.width, &ret.height, &ret.channels, &ret.warning, &err);
#elif !defined(TINYUSDZ_NO_BUILTIN_IMAGE_LOADER)
  bool ok = GetImageInfoSTB(addr, sz, uri, &ret.width, &ret.height, &ret.channels, &ret.warning, &err);
#else
  (void)addr;
  (void)sz;
  (void)uri;
  bool ok = false;
  err = "Image loading feature is disabled in this build. TODO: use user-supplied image info function\n";
#endif
  if (!ok) {
    return nonstd::make_unexpected(err);
  }

  return std::move(ret);
}